

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

LY_ERR ly_path_check_predicate
                 (ly_ctx *ctx,lysc_node *cur_node,lyxp_expr *exp,uint32_t *tok_idx,uint16_t prefix,
                 uint16_t pred)

{
  lysc_node *ctx_00;
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  ulong local_58;
  size_t name_len;
  char *name;
  ly_set *plStack_40;
  uint32_t i;
  ly_set *set;
  LY_ERR ret;
  uint16_t pred_local;
  uint16_t prefix_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  lysc_node *cur_node_local;
  ly_ctx *ctx_local;
  
  set._0_4_ = LY_SUCCESS;
  plStack_40 = (ly_set *)0x0;
  set._4_2_ = pred;
  set._6_2_ = prefix;
  _ret = tok_idx;
  tok_idx_local = (uint32_t *)exp;
  exp_local = (lyxp_expr *)cur_node;
  cur_node_local = (lysc_node *)ctx;
  if (cur_node != (lysc_node *)0x0) {
    ly_log_location(cur_node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  }
  LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,LYXP_TOKEN_BRACK1);
  if (LVar1 == LY_SUCCESS) {
    if (((set._4_2_ != 0x200) && (set._4_2_ != 0x100)) ||
       (LVar1 = lyxp_check_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,*_ret,LYXP_TOKEN_NAMETEST)
       , LVar1 != LY_SUCCESS)) {
      if ((set._4_2_ == 0x200) &&
         (LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,LYXP_TOKEN_DOT),
         LVar1 == LY_SUCCESS)) {
        LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                LYXP_TOKEN_OPER_EQUAL);
        if (LVar1 == LY_SUCCESS) {
          pvVar4 = calloc(2,4);
          *(void **)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) = pvVar4;
          if (*(long *)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) == 0) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "ly_path_check_predicate");
            set._0_4_ = LY_EMEM;
          }
          else {
            **(undefined4 **)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) = 3;
            LVar1 = lyxp_next_token2((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                     LYXP_TOKEN_LITERAL,LYXP_TOKEN_NUMBER);
            if ((LVar1 != LY_SUCCESS) ||
               (LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                        LYXP_TOKEN_BRACK2), LVar1 != LY_SUCCESS)) goto LAB_00117251;
          }
          goto LAB_0011721f;
        }
      }
      else if ((set._4_2_ == 0x200) &&
              (LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,
                                       LYXP_TOKEN_NUMBER), LVar1 == LY_SUCCESS)) {
        iVar2 = atoi((char *)(*(long *)(tok_idx_local + 10) +
                             (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)(*_ret - 1) * 4)
                             ));
        if (iVar2 == 0) {
          ly_vlog((ly_ctx *)cur_node_local,(char *)0x0,LYVE_XPATH,
                  "Invalid positional predicate \"%.*s\".",
                  (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)(*_ret - 1) * 4),
                  *(long *)(tok_idx_local + 10) +
                  (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)(*_ret - 1) * 4));
        }
        else {
          LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                  LYXP_TOKEN_BRACK2);
          if (LVar1 == LY_SUCCESS) goto LAB_0011721f;
        }
      }
      else {
        if ((set._4_2_ == 0x400) &&
           (LVar1 = lyxp_check_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,*_ret,
                                     LYXP_TOKEN_NAMETEST), LVar1 == LY_SUCCESS)) {
          if (set._6_2_ != 0x10) {
            __assert_fail("prefix == LY_PATH_PREFIX_OPTIONAL",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                          ,0xa5,
                          "LY_ERR ly_path_check_predicate(const struct ly_ctx *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, uint16_t, uint16_t)"
                         );
          }
          set._0_4_ = ly_set_new(&stack0xffffffffffffffc0);
          if ((LY_ERR)set == LY_SUCCESS) {
            set._0_4_ = LY_SUCCESS;
            do {
              LVar1 = lyxp_check_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,*_ret,
                                       LYXP_TOKEN_NAMETEST);
              if (LVar1 != LY_SUCCESS) goto LAB_00117251;
              pcVar3 = strnstr((char *)(*(long *)(tok_idx_local + 10) +
                                       (ulong)*(uint *)(*(long *)(tok_idx_local + 2) +
                                                       (ulong)*_ret * 4)),":",
                               (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4));
              if (pcVar3 == (char *)0x0) {
                name_len = *(long *)(tok_idx_local + 10) +
                           (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4);
                local_58 = (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4);
              }
              else {
                name_len = (size_t)(pcVar3 + 1);
                local_58 = (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4) -
                           (name_len -
                           (*(long *)(tok_idx_local + 10) +
                           (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4)));
              }
              for (name._4_4_ = 0; name._4_4_ < plStack_40->count; name._4_4_ = name._4_4_ + 1) {
                iVar2 = strncmp((char *)(plStack_40->field_2).dnodes[name._4_4_],(char *)name_len,
                                local_58);
                if ((iVar2 == 0) &&
                   (LVar1 = lysp_check_identifierchar
                                      ((lysp_ctx *)0x0,
                                       (int)*(char *)((long)&(plStack_40->field_2).dnodes
                                                             [name._4_4_]->hash + local_58),'\0',
                                       (uint8_t *)0x0), LVar1 != LY_SUCCESS)) {
                  ly_vlog((ly_ctx *)cur_node_local,(char *)0x0,LYVE_XPATH,
                          "Duplicate predicate key \"%.*s\" in path.",local_58 & 0xffffffff,name_len
                         );
                  goto LAB_00117251;
                }
              }
              set._0_4_ = ly_set_add(plStack_40,(void *)name_len,'\x01',(uint32_t *)0x0);
              if ((LY_ERR)set != LY_SUCCESS) break;
              *_ret = *_ret + 1;
              LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                      LYXP_TOKEN_OPER_EQUAL);
              if (LVar1 != LY_SUCCESS) goto LAB_00117251;
              pvVar4 = calloc(2,4);
              *(void **)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) = pvVar4;
              if (*(long *)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) == 0) {
                ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "ly_path_check_predicate");
                set._0_4_ = LY_EMEM;
                break;
              }
              **(undefined4 **)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) = 3;
              LVar1 = lyxp_check_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,*_ret,
                                       LYXP_TOKEN_FUNCNAME);
              if (LVar1 != LY_SUCCESS) goto LAB_00117251;
              if ((*(int *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4) != 7) ||
                 (iVar2 = strncmp((char *)(*(long *)(tok_idx_local + 10) +
                                          (ulong)*(uint *)(*(long *)(tok_idx_local + 2) +
                                                          (ulong)*_ret * 4)),"current",7),
                 iVar2 != 0)) {
                ly_vlog((ly_ctx *)cur_node_local,(char *)0x0,LYVE_XPATH,
                        "Invalid function \"%.*s\" invocation in path.",
                        (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4),
                        *(long *)(tok_idx_local + 10) +
                        (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4));
                goto LAB_00117251;
              }
              *_ret = *_ret + 1;
              LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                      LYXP_TOKEN_PAR1);
              if ((((LVar1 != LY_SUCCESS) ||
                   (LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret
                                            ,LYXP_TOKEN_PAR2), LVar1 != LY_SUCCESS)) ||
                  (LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                           LYXP_TOKEN_OPER_PATH), LVar1 != LY_SUCCESS)) ||
                 (LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                          LYXP_TOKEN_DDOT), LVar1 != LY_SUCCESS)) goto LAB_00117251;
              do {
                LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                        LYXP_TOKEN_OPER_PATH);
                if (LVar1 != LY_SUCCESS) goto LAB_00117251;
                LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,
                                        LYXP_TOKEN_DDOT);
              } while (LVar1 == LY_SUCCESS);
              LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                      LYXP_TOKEN_NAMETEST);
              while( true ) {
                if (LVar1 != LY_SUCCESS) goto LAB_00117251;
                LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,
                                        LYXP_TOKEN_OPER_PATH);
                if (LVar1 != LY_SUCCESS) break;
                LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                        LYXP_TOKEN_NAMETEST);
              }
              LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                      LYXP_TOKEN_BRACK2);
              if (LVar1 != LY_SUCCESS) goto LAB_00117251;
              LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,
                                      LYXP_TOKEN_BRACK1);
            } while (LVar1 == LY_SUCCESS);
          }
          goto LAB_0011721f;
        }
        LVar1 = lyxp_check_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,*_ret,
                                 LYXP_TOKEN_NONE);
        ctx_00 = cur_node_local;
        if (LVar1 == LY_SUCCESS) {
          pcVar3 = lyxp_token2str(*(lyxp_token *)(*(long *)tok_idx_local + (ulong)*_ret * 4));
          ly_vlog((ly_ctx *)ctx_00,(char *)0x0,LYVE_XPATH,
                  "Unexpected XPath token \"%s\" (\"%.15s\").",pcVar3,
                  *(long *)(tok_idx_local + 10) +
                  (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4));
        }
      }
LAB_00117251:
      ly_log_location_revert((uint)(exp_local != (lyxp_expr *)0x0),0,0,0);
      ly_set_free(plStack_40,(_func_void_void_ptr *)0x0);
      return LY_EVALID;
    }
    set._0_4_ = ly_set_new(&stack0xffffffffffffffc0);
    if ((LY_ERR)set == LY_SUCCESS) {
      set._0_4_ = LY_SUCCESS;
      do {
        LVar1 = lyxp_check_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,*_ret,
                                 LYXP_TOKEN_NAMETEST);
        if (LVar1 != LY_SUCCESS) goto LAB_00117251;
        pcVar3 = strnstr((char *)(*(long *)(tok_idx_local + 10) +
                                 (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4)),
                         ":",(ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4));
        if ((set._6_2_ == 0x20) && (pcVar3 == (char *)0x0)) {
          ly_vlog((ly_ctx *)cur_node_local,(char *)0x0,LYVE_XPATH,
                  "Prefix missing for \"%.*s\" in path.",
                  (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4),
                  *(long *)(tok_idx_local + 10) +
                  (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4));
          goto LAB_00117251;
        }
        if ((set._6_2_ == 0x80) && (pcVar3 != (char *)0x0)) {
          ly_vlog((ly_ctx *)cur_node_local,(char *)0x0,LYVE_XPATH,
                  "Redundant prefix for \"%.*s\" in path.",
                  (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4),
                  *(long *)(tok_idx_local + 10) +
                  (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4));
          goto LAB_00117251;
        }
        if (pcVar3 == (char *)0x0) {
          name_len = *(long *)(tok_idx_local + 10) +
                     (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4);
          local_58 = (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4);
        }
        else {
          name_len = (size_t)(pcVar3 + 1);
          local_58 = (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)*_ret * 4) -
                     (name_len -
                     (*(long *)(tok_idx_local + 10) +
                     (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)*_ret * 4)));
        }
        for (name._4_4_ = 0; name._4_4_ < plStack_40->count; name._4_4_ = name._4_4_ + 1) {
          iVar2 = strncmp((char *)(plStack_40->field_2).dnodes[name._4_4_],(char *)name_len,local_58
                         );
          if ((iVar2 == 0) &&
             (LVar1 = lysp_check_identifierchar
                                ((lysp_ctx *)0x0,
                                 (int)*(char *)((long)&(plStack_40->field_2).dnodes[name._4_4_]->
                                                       hash + local_58),'\0',(uint8_t *)0x0),
             LVar1 != LY_SUCCESS)) {
            ly_vlog((ly_ctx *)cur_node_local,(char *)0x0,LYVE_XPATH,
                    "Duplicate predicate key \"%.*s\" in path.",local_58 & 0xffffffff,name_len);
            goto LAB_00117251;
          }
        }
        set._0_4_ = ly_set_add(plStack_40,(void *)name_len,'\x01',(uint32_t *)0x0);
        if ((LY_ERR)set != LY_SUCCESS) break;
        *_ret = *_ret + 1;
        LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                LYXP_TOKEN_OPER_EQUAL);
        if (LVar1 != LY_SUCCESS) goto LAB_00117251;
        pvVar4 = calloc(2,4);
        *(void **)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) = pvVar4;
        if (*(long *)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) == 0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "ly_path_check_predicate");
          set._0_4_ = LY_EMEM;
          break;
        }
        **(undefined4 **)(*(long *)(tok_idx_local + 6) + (ulong)(*_ret - 2) * 8) = 3;
        LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,LYXP_TOKEN_LITERAL);
        if (((LVar1 != LY_SUCCESS) &&
            (LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,LYXP_TOKEN_NUMBER
                                    ), LVar1 != LY_SUCCESS)) &&
           (LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,LYXP_TOKEN_VARREF)
           , LVar1 != LY_SUCCESS)) {
          lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                          LYXP_TOKEN_LITERAL);
          goto LAB_00117251;
        }
        LVar1 = lyxp_next_token((ly_ctx *)cur_node_local,(lyxp_expr *)tok_idx_local,_ret,
                                LYXP_TOKEN_BRACK2);
        if (LVar1 != LY_SUCCESS) goto LAB_00117251;
        LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,_ret,LYXP_TOKEN_BRACK1);
      } while (LVar1 == LY_SUCCESS);
    }
  }
LAB_0011721f:
  ly_log_location_revert((uint)(exp_local != (lyxp_expr *)0x0),0,0,0);
  ly_set_free(plStack_40,(_func_void_void_ptr *)0x0);
  return (LY_ERR)set;
}

Assistant:

static LY_ERR
ly_path_check_predicate(const struct ly_ctx *ctx, const struct lysc_node *cur_node, const struct lyxp_expr *exp,
        uint32_t *tok_idx, uint16_t prefix, uint16_t pred)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_set *set = NULL;
    uint32_t i;
    const char *name;
    size_t name_len;

    if (cur_node) {
        LOG_LOCSET(cur_node, NULL);
    }

    if (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1)) {
        /* '[' */

        if (((pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_KEYS)) &&
                !lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_NAMETEST)) {
            ret = ly_set_new(&set);
            LY_CHECK_GOTO(ret, cleanup);

            do {
                /* NameTest is always expected here */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                /* check prefix based on the options */
                name = strnstr(exp->expr + exp->tok_pos[*tok_idx], ":", exp->tok_len[*tok_idx]);
                if ((prefix == LY_PATH_PREFIX_MANDATORY) && !name) {
                    LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)exp->tok_len[*tok_idx],
                            exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                } else if ((prefix == LY_PATH_PREFIX_STRICT_INHERIT) && name) {
                    LOGVAL(ctx, LYVE_XPATH, "Redundant prefix for \"%.*s\" in path.", (int)exp->tok_len[*tok_idx],
                            exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                }
                if (!name) {
                    name = exp->expr + exp->tok_pos[*tok_idx];
                    name_len = exp->tok_len[*tok_idx];
                } else {
                    ++name;
                    name_len = exp->tok_len[*tok_idx] - (name - (exp->expr + exp->tok_pos[*tok_idx]));
                }

                /* check whether it was not already specified */
                for (i = 0; i < set->count; ++i) {
                    /* all the keys must be from the same module so this comparison should be fine */
                    if (!strncmp(set->objs[i], name, name_len) &&
                            lysp_check_identifierchar(NULL, ((char *)set->objs[i])[name_len], 0, NULL)) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate predicate key \"%.*s\" in path.", (int)name_len, name);
                        goto token_error;
                    }
                }

                /* add it into the set */
                ret = ly_set_add(set, (void *)name, 1, NULL);
                LY_CHECK_GOTO(ret, cleanup);

                /* NameTest */
                ++(*tok_idx);

                /* '=' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

                /* fill repeat */
                exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
                LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
                exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

                /* Literal, Number, or VariableReference */
                if (lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_LITERAL) &&
                        lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_NUMBER) &&
                        lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_VARREF)) {
                    /* error */
                    lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_LITERAL);
                    goto token_error;
                }

                /* ']' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

                /* '[' */
            } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1));

        } else if ((pred == LY_PATH_PRED_SIMPLE) && !lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_DOT)) {
            /* '.' */

            /* '=' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

            /* fill repeat */
            exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
            LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
            exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

            /* Literal or Number */
            LY_CHECK_GOTO(lyxp_next_token2(ctx, exp, tok_idx, LYXP_TOKEN_LITERAL, LYXP_TOKEN_NUMBER), token_error);

            /* ']' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

        } else if ((pred == LY_PATH_PRED_SIMPLE) && !lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_NUMBER)) {
            /* Number */

            /* check for index 0 */
            if (!atoi(exp->expr + exp->tok_pos[*tok_idx - 1])) {
                LOGVAL(ctx, LYVE_XPATH, "Invalid positional predicate \"%.*s\".", (int)exp->tok_len[*tok_idx - 1],
                        exp->expr + exp->tok_pos[*tok_idx - 1]);
                goto token_error;
            }

            /* ']' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

        } else if ((pred == LY_PATH_PRED_LEAFREF) && !lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_NAMETEST)) {
            assert(prefix == LY_PATH_PREFIX_OPTIONAL);
            ret = ly_set_new(&set);
            LY_CHECK_GOTO(ret, cleanup);

            do {
                /* NameTest is always expected here */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                name = strnstr(exp->expr + exp->tok_pos[*tok_idx], ":", exp->tok_len[*tok_idx]);
                if (!name) {
                    name = exp->expr + exp->tok_pos[*tok_idx];
                    name_len = exp->tok_len[*tok_idx];
                } else {
                    ++name;
                    name_len = exp->tok_len[*tok_idx] - (name - (exp->expr + exp->tok_pos[*tok_idx]));
                }

                /* check whether it was not already specified */
                for (i = 0; i < set->count; ++i) {
                    /* all the keys must be from the same module so this comparison should be fine */
                    if (!strncmp(set->objs[i], name, name_len) &&
                            lysp_check_identifierchar(NULL, ((char *)set->objs[i])[name_len], 0, NULL)) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate predicate key \"%.*s\" in path.", (int)name_len, name);
                        goto token_error;
                    }
                }

                /* add it into the set */
                ret = ly_set_add(set, (void *)name, 1, NULL);
                LY_CHECK_GOTO(ret, cleanup);

                /* NameTest */
                ++(*tok_idx);

                /* '=' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

                /* fill repeat */
                exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
                LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
                exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

                /* FuncName */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_FUNCNAME), token_error);
                if ((exp->tok_len[*tok_idx] != ly_strlen_const("current")) ||
                        strncmp(exp->expr + exp->tok_pos[*tok_idx], "current", ly_strlen_const("current"))) {
                    LOGVAL(ctx, LYVE_XPATH, "Invalid function \"%.*s\" invocation in path.",
                            (int)exp->tok_len[*tok_idx], exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                }
                ++(*tok_idx);

                /* '(' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_PAR1), token_error);

                /* ')' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_PAR2), token_error);

                /* '/' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_PATH), token_error);

                /* '..' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_DDOT), token_error);
                do {
                    /* '/' */
                    LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_PATH), token_error);
                } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_DDOT));

                /* NameTest */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                /* '/' */
                while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_OPER_PATH)) {
                    /* NameTest */
                    LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), token_error);
                }

                /* ']' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

                /* '[' */
            } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1));

        } else if (lyxp_check_token(ctx, exp, *tok_idx, 0)) {
            /* unexpected EOF */
            goto token_error;
        } else {
            /* invalid token */
            LOGVAL(ctx, LY_VCODE_XP_INTOK, lyxp_token2str(exp->tokens[*tok_idx]), exp->expr + exp->tok_pos[*tok_idx]);
            goto token_error;
        }
    }

cleanup:
    LOG_LOCBACK(cur_node ? 1 : 0, 0);
    ly_set_free(set, NULL);
    return ret;

token_error:
    LOG_LOCBACK(cur_node ? 1 : 0, 0);
    ly_set_free(set, NULL);
    return LY_EVALID;
}